

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

UnicodeString * __thiscall icu_63::CalendarAstronomer::Horizon::toString(Horizon *this)

{
  UnicodeString *in_RDI;
  
  (in_RDI->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (in_RDI->fUnion).fStackFields.fLengthAndFlags = 2;
  return in_RDI;
}

Assistant:

UnicodeString CalendarAstronomer::Horizon::toString() const
{
#ifdef U_DEBUG_ASTRO
    char tmp[800];
    sprintf(tmp, "[%.5f,%.5f]", altitude*RAD_DEG, azimuth*RAD_DEG);
    return UnicodeString(tmp, "");
#else
    return UnicodeString();
#endif
}